

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  uchar *data_00;
  float *pfVar1;
  undefined8 in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  uchar *data;
  stbi__context *in_stack_fffffffffffffff8;
  
  data_00 = stbi__load_and_postprocess_8bit
                      (in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20));
  if (data_00 == (uchar *)0x0) {
    stbi__err("unknown image type");
    pfVar1 = (float *)0x0;
  }
  else {
    pfVar1 = stbi__ldr_to_hdr(data_00,*in_RDX,*in_RSI,(int)((ulong)data_00 >> 0x20));
  }
  return pfVar1;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}